

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O2

void __thiscall wallet::RecordsPage::Unserialize<AutoFile>(RecordsPage *this,AutoFile *s)

{
  runtime_error *this_00;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int64_t offset;
  long in_FS_OFFSET;
  DataRecord record;
  RecordHeader rec_hdr;
  uint16_t index;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0;
  lVar5 = 0x1a;
  lVar3 = 0x19;
  lVar4 = -0x1c;
  do {
    if ((this->m_header).entries <= uVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
LAB_009d2d8a:
      __stack_chk_fail();
    }
    index = ser_readdata16<AutoFile>(s);
    if ((this->m_header).other_endian == true) {
      index = index << 8 | index >> 8;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(&this->indexes,&index);
    uVar2 = (ulong)index;
    if ((long)(lVar4 + uVar2) < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Data record position not in page");
LAB_009d2d24:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_009d2d8a;
    }
    lVar5 = lVar5 + 2;
    AutoFile::ignore(s,lVar4 + uVar2);
    rec_hdr.other_endian = (this->m_header).other_endian;
    RecordHeader::Unserialize<AutoFile>(&rec_hdr,s);
    if (rec_hdr.type == OVERFLOW_DATA) {
      offset = -0xc - (uVar2 - lVar5);
      record.m_header.other_endian = rec_hdr.other_endian;
      record.m_header._5_1_ = rec_hdr._5_1_;
      record.m_header.len = rec_hdr.len;
      record.m_header.type = rec_hdr.type;
      record.m_header.deleted = rec_hdr.deleted;
      OverflowRecord::Unserialize<AutoFile>((OverflowRecord *)&record,s);
      std::
      vector<std::variant<wallet::DataRecord,wallet::OverflowRecord>,std::allocator<std::variant<wallet::DataRecord,wallet::OverflowRecord>>>
      ::emplace_back<wallet::OverflowRecord&>
                ((vector<std::variant<wallet::DataRecord,wallet::OverflowRecord>,std::allocator<std::variant<wallet::DataRecord,wallet::OverflowRecord>>>
                  *)&this->records,(OverflowRecord *)&record);
    }
    else {
      if (rec_hdr.type != KEYDATA) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Unknown record type in records page");
        goto LAB_009d2d24;
      }
      record.m_header.other_endian = rec_hdr.other_endian;
      record.m_header._5_1_ = rec_hdr._5_1_;
      record.m_header.len = rec_hdr.len;
      record.m_header.type = rec_hdr.type;
      record.m_header.deleted = rec_hdr.deleted;
      record.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      record.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      record.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      DataRecord::Unserialize<AutoFile>(&record,s);
      std::
      vector<std::variant<wallet::DataRecord,wallet::OverflowRecord>,std::allocator<std::variant<wallet::DataRecord,wallet::OverflowRecord>>>
      ::emplace_back<wallet::DataRecord&>
                ((vector<std::variant<wallet::DataRecord,wallet::OverflowRecord>,std::allocator<std::variant<wallet::DataRecord,wallet::OverflowRecord>>>
                  *)&this->records,&record);
      offset = lVar3 - (uVar2 + rec_hdr.len);
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&record.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
    }
    AutoFile::seek(s,offset,1);
    uVar1 = uVar1 + 1;
    lVar3 = lVar3 + 2;
    lVar4 = lVar4 + -2;
  } while( true );
}

Assistant:

void Unserialize(Stream& s)
    {
        // Current position within the page
        int64_t pos = PageHeader::SIZE;

        // Get the items
        for (uint32_t i = 0; i < m_header.entries; ++i) {
            // Get the index
            uint16_t index;
            s >> index;
            if (m_header.other_endian) {
                index = internal_bswap_16(index);
            }
            indexes.push_back(index);
            pos += sizeof(uint16_t);

            // Go to the offset from the index
            int64_t to_jump = index - pos;
            if (to_jump < 0) {
                throw std::runtime_error("Data record position not in page");
            }
            s.ignore(to_jump);

            // Read the record
            RecordHeader rec_hdr(m_header.other_endian);
            s >> rec_hdr;
            to_jump += RecordHeader::SIZE;

            switch (rec_hdr.type) {
            case RecordType::KEYDATA: {
                DataRecord record(rec_hdr);
                s >> record;
                records.emplace_back(record);
                to_jump += rec_hdr.len;
                break;
            }
            case RecordType::OVERFLOW_DATA: {
                OverflowRecord record(rec_hdr);
                s >> record;
                records.emplace_back(record);
                to_jump += OverflowRecord::SIZE;
                break;
            }
            default:
                throw std::runtime_error("Unknown record type in records page");
            }

            // Go back to the indexes
            s.seek(-to_jump, SEEK_CUR);
        }
    }